

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3<float>
pbrt::Lerp<pbrt::Vector3,float>
          (Float t,Tuple3<pbrt::Vector3,_float> *t0,Tuple3<pbrt::Vector3,_float> *t1)

{
  Vector3<float> VVar1;
  Vector3<float> VVar2;
  Vector3<float> VVar3;
  undefined4 local_18;
  undefined4 uStack_14;
  
  VVar1 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)t0,1.0 - t);
  VVar2 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)t1,t);
  local_18 = VVar1.super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_14 = VVar1.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar3.super_Tuple3<pbrt::Vector3,_float>.x = VVar2.super_Tuple3<pbrt::Vector3,_float>.x + local_18
  ;
  VVar3.super_Tuple3<pbrt::Vector3,_float>.y =
       VVar2.super_Tuple3<pbrt::Vector3,_float>.y + uStack_14;
  VVar3.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar2.super_Tuple3<pbrt::Vector3,_float>.z + VVar1.super_Tuple3<pbrt::Vector3,_float>.z;
  return (Vector3<float>)VVar3.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU inline auto Lerp(Float t, const Tuple3<C, T> &t0, const Tuple3<C, T> &t1) {
    return (1 - t) * t0 + t * t1;
}